

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O0

void __thiscall Shader::checkCompileErrors(Shader *this,GLuint shader,string *type)

{
  bool bVar1;
  ostream *poVar2;
  GLchar local_428 [8];
  GLchar infoLog [1024];
  GLint success;
  string *type_local;
  GLuint shader_local;
  Shader *this_local;
  
  bVar1 = std::operator!=(type,"PROGRAM");
  if (bVar1) {
    (*glad_glGetShaderiv)(shader,0x8b81,(GLint *)(infoLog + 0x3fc));
    if (infoLog._1020_4_ == 0) {
      (*glad_glGetShaderInfoLog)(shader,0x400,(GLsizei *)0x0,local_428);
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER_COMPILATION_ERROR of type: ");
      poVar2 = std::operator<<(poVar2,(string *)type);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,local_428);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    (*glad_glGetProgramiv)(shader,0x8b82,(GLint *)(infoLog + 0x3fc));
    if (infoLog._1020_4_ == 0) {
      (*glad_glGetProgramInfoLog)(shader,0x400,(GLsizei *)0x0,local_428);
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR::PROGRAM_LINKING_ERROR of type: ");
      poVar2 = std::operator<<(poVar2,(string *)type);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,local_428);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void checkCompileErrors(GLuint shader,string type)
    {
        GLint success;
        GLchar infoLog[1024];
        if(type != "PROGRAM")
        {
            glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
            if(!success)
            {
                glGetShaderInfoLog(shader, 1024, NULL, infoLog);
                cout << "ERROR::SHADER_COMPILATION_ERROR of type: "<<type<<"\n"<<infoLog<<endl;
            }
        }
        else
        {
            glGetProgramiv(shader, GL_LINK_STATUS, &success);
            if(!success)
            {
                glGetProgramInfoLog(shader, 1024, NULL, infoLog);
                cout << "ERROR::PROGRAM_LINKING_ERROR of type: " << type << "\n"<<infoLog<<endl;
            }
        }
    }